

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::protos::gen::StatsdPullAtomConfig::~StatsdPullAtomConfig(StatsdPullAtomConfig *this)

{
  ~StatsdPullAtomConfig(this);
  operator_delete(this,0x80);
  return;
}

Assistant:

StatsdPullAtomConfig::~StatsdPullAtomConfig() = default;